

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_aggregate.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,BoundAggregateExpression *aggr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer this_00;
  pointer pEVar4;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  LogicalType *this_01;
  vector<duckdb::BaseStatistics,_true> stats;
  AggregateStatisticsInput input;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  undefined1 local_a8 [32];
  tuple<duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_> local_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  
  local_c8._0_8_ = (LogicalOperator *)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_b8._M_p = (pointer)0x0;
  local_d8._8_8_ = this;
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::reserve
            ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)local_c8,
             (long)expr_ptr[0x32].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl -
             (long)expr_ptr[0x31].
                   super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
                   _M_t.
                   super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                   .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl >> 3);
  _Var5._M_head_impl =
       expr_ptr[0x31].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  _Var1._M_head_impl =
       expr_ptr[0x32].super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  local_a8._0_8_ = expr_ptr;
  if (_Var5._M_head_impl != _Var1._M_head_impl) {
    do {
      this_01 = (LogicalType *)(local_a8 + 8);
      PropagateExpression((StatisticsPropagator *)local_d8,
                          (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)aggr);
      if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
          local_d8._0_8_ == (BaseStatistics *)0x0) {
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)_Var5._M_head_impl);
        LogicalType::LogicalType(this_01,&pEVar4->return_type);
        BaseStatistics::CreateUnknown((BaseStatistics *)&local_88,this_01);
        ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::
        emplace_back<duckdb::BaseStatistics>
                  ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)
                   local_c8,(BaseStatistics *)&local_88);
        BaseStatistics::~BaseStatistics((BaseStatistics *)&local_88);
        LogicalType::~LogicalType(this_01);
      }
      else {
        this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                *)local_d8);
        BaseStatistics::Copy((BaseStatistics *)&local_88,this_00);
        ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::
        emplace_back<duckdb::BaseStatistics>
                  ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)
                   local_c8,(BaseStatistics *)&local_88);
        BaseStatistics::~BaseStatistics((BaseStatistics *)&local_88);
      }
      uVar3 = local_d8._0_8_;
      if ((Optimizer *)local_d8._0_8_ != (Optimizer *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_d8._0_8_);
        operator_delete((void *)uVar3);
      }
      _Var5._M_head_impl = (Expression *)&((_Var5._M_head_impl)->super_BaseExpression).type;
    } while (_Var5._M_head_impl != _Var1._M_head_impl);
  }
  uVar3 = local_d8._8_8_;
  _Var5._M_head_impl =
       (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
        (local_a8._0_8_ + 0x158))->
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if (_Var5._M_head_impl == (Expression *)0x0) {
    *(undefined8 *)local_d8._8_8_ = 0;
  }
  else {
    local_88.
    super__Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>.
    super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)
         (((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
          (local_a8._0_8_ + 0x1a0))->
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    local_78._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (aggr->super_Expression).verification_stats.
         super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
    local_80 = (element_type *)local_c8;
    uVar2._0_1_ = (aggr->super_Expression).super_BaseExpression.type;
    uVar2._1_1_ = (aggr->super_Expression).super_BaseExpression.expression_class;
    uVar2._2_6_ = *(undefined6 *)&(aggr->super_Expression).super_BaseExpression.field_0xa;
    (*(code *)_Var5._M_head_impl)(local_d8._8_8_,uVar2);
  }
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::~vector
            ((vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> *)local_c8);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
         uVar3;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(BoundAggregateExpression &aggr,
                                                                     unique_ptr<Expression> &expr_ptr) {
	vector<BaseStatistics> stats;
	stats.reserve(aggr.children.size());
	for (auto &child : aggr.children) {
		auto stat = PropagateExpression(child);
		if (!stat) {
			stats.push_back(BaseStatistics::CreateUnknown(child->return_type));
		} else {
			stats.push_back(stat->Copy());
		}
	}
	if (!aggr.function.statistics) {
		return nullptr;
	}
	AggregateStatisticsInput input(aggr.bind_info.get(), stats, node_stats.get());
	return aggr.function.statistics(context, aggr, input);
}